

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

void __thiscall Minisat::SimpSolver::reserveVars(SimpSolver *this,Var v)

{
  int min_cap;
  char local_19;
  
  Solver::reserveVars(&this->super_Solver,v);
  min_cap = v + 1;
  vec<char>::capacity(&this->frozen,min_cap);
  vec<char>::capacity(&this->eliminated,min_cap);
  if (this->use_simplification == true) {
    vec<int>::capacity(&this->n_occ,min_cap);
    vec<int>::capacity(&this->n_occ,min_cap);
    vec<Minisat::vec<unsigned_int>_>::growTo(&(this->occurs).occs,min_cap);
    local_19 = '\0';
    vec<char>::growTo(&(this->occurs).dirty,min_cap,&local_19);
    vec<char>::capacity(&this->touched,min_cap);
  }
  return;
}

Assistant:

void SimpSolver::reserveVars(Var v)
{
    Solver::reserveVars(v);

    frozen.capacity(v + 1);
    eliminated.capacity(v + 1);

    if (use_simplification) {
        n_occ.capacity(v + 1);
        n_occ.capacity(v + 1);
        occurs.init(v);
        touched.capacity(v + 1);
    }
}